

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

void xmlSAX2EndElementNs(void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI)

{
  xmlDocPtr doc;
  uint uVar1;
  xmlParserCtxtPtr ctxt;
  
  if (ctx != (void *)0x0) {
    *(undefined4 *)((long)ctx + 0x1a0) = 0xffffffff;
    if ((((*(int *)((long)ctx + 0x9c) != 0) && (*(int *)((long)ctx + 0x18) != 0)) &&
        (doc = *(xmlDocPtr *)((long)ctx + 0x10), doc != (xmlDocPtr)0x0)) &&
       (doc->intSubset != (_xmlDtd *)0x0)) {
      uVar1 = xmlValidateOneElement
                        ((xmlValidCtxtPtr)((long)ctx + 0xa0),doc,*(xmlNodePtr *)((long)ctx + 0x50));
      *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar1;
    }
    nodePop((xmlParserCtxtPtr)ctx);
    return;
  }
  return;
}

Assistant:

void
xmlSAX2EndElementNs(void *ctx,
                    const xmlChar * localname ATTRIBUTE_UNUSED,
                    const xmlChar * prefix ATTRIBUTE_UNUSED,
		    const xmlChar * URI ATTRIBUTE_UNUSED)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;

    if (ctx == NULL) return;
    ctxt->nodemem = -1;

#ifdef LIBXML_VALID_ENABLED
    if (ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset)
        ctxt->valid &= xmlValidateOneElement(&ctxt->vctxt, ctxt->myDoc,
                                             ctxt->node);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * end of parsing of this node.
     */
    nodePop(ctxt);
}